

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5yy_destructor(fts5yyParser *fts5yypParser,uchar fts5yymajor,fts5YYMINORTYPE *fts5yypminor)

{
  undefined7 in_register_00000031;
  
  switch((int)fts5yypParser) {
  case 0x11:
  case 0x12:
  case 0x13:
    sqlite3Fts5ParseNodeFree(*(Fts5ExprNode **)CONCAT71(in_register_00000031,fts5yymajor));
    return;
  case 0x14:
  case 0x15:
    sqlite3_free(*(void **)CONCAT71(in_register_00000031,fts5yymajor));
    return;
  case 0x16:
  case 0x17:
    sqlite3Fts5ParseNearsetFree(*(Fts5ExprNearset **)CONCAT71(in_register_00000031,fts5yymajor));
    return;
  case 0x18:
    fts5ExprPhraseFree(*(Fts5ExprPhrase **)CONCAT71(in_register_00000031,fts5yymajor));
    return;
  default:
    return;
  }
}

Assistant:

static void fts5yy_destructor(
  fts5yyParser *fts5yypParser,    /* The parser */
  fts5YYCODETYPE fts5yymajor,     /* Type code for object to destroy */
  fts5YYMINORTYPE *fts5yypminor   /* The object to be destroyed */
){
  sqlite3Fts5ParserARG_FETCH
  sqlite3Fts5ParserCTX_FETCH
  switch( fts5yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is 
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are *not* used
    ** inside the C code.
    */
/********* Begin destructor definitions ***************************************/
    case 16: /* input */
{
 (void)pParse; 
}
      break;
    case 17: /* expr */
    case 18: /* cnearset */
    case 19: /* exprlist */
{
 sqlite3Fts5ParseNodeFree((fts5yypminor->fts5yy24)); 
}
      break;
    case 20: /* colset */
    case 21: /* colsetlist */
{
 sqlite3_free((fts5yypminor->fts5yy11)); 
}
      break;
    case 22: /* nearset */
    case 23: /* nearphrases */
{
 sqlite3Fts5ParseNearsetFree((fts5yypminor->fts5yy46)); 
}
      break;
    case 24: /* phrase */
{
 sqlite3Fts5ParsePhraseFree((fts5yypminor->fts5yy53)); 
}
      break;
/********* End destructor definitions *****************************************/
    default:  break;   /* If no destructor action specified: do nothing */
  }
}